

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page-queue.c
# Opt level: O2

void mi_page_queue_remove(mi_page_queue_t *queue,mi_page_t *page)

{
  size_t *psVar1;
  mi_heap_t *heap;
  mi_page_s *pmVar2;
  mi_page_s *pmVar3;
  
  heap = (mi_heap_t *)page->xheap;
  pmVar2 = page->next;
  pmVar3 = page->prev;
  if (pmVar3 != (mi_page_s *)0x0) {
    pmVar3->next = pmVar2;
  }
  if (pmVar2 != (mi_page_s *)0x0) {
    pmVar2->prev = pmVar3;
  }
  if (queue->last == page) {
    queue->last = page->prev;
  }
  if (queue->first == page) {
    queue->first = pmVar2;
    mi_heap_queue_first_update(heap,queue);
  }
  psVar1 = &heap->page_count;
  *psVar1 = *psVar1 - 1;
  page->next = (mi_page_s *)0x0;
  page->prev = (mi_page_s *)0x0;
  (page->flags).full_aligned = (page->flags).full_aligned & 0xfe;
  return;
}

Assistant:

static void mi_page_queue_remove(mi_page_queue_t* queue, mi_page_t* page) {
  mi_assert_internal(page != NULL);
  mi_assert_expensive(mi_page_queue_contains(queue, page));
  mi_assert_internal(mi_page_block_size(page) == queue->block_size ||
                      (mi_page_is_large_or_huge(page) && mi_page_queue_is_huge(queue)) ||
                        (mi_page_is_in_full(page) && mi_page_queue_is_full(queue)));
  mi_heap_t* heap = mi_page_heap(page);

  if (page->prev != NULL) page->prev->next = page->next;
  if (page->next != NULL) page->next->prev = page->prev;
  if (page == queue->last)  queue->last = page->prev;
  if (page == queue->first) {
    queue->first = page->next;
    // update first
    mi_assert_internal(mi_heap_contains_queue(heap, queue));
    mi_heap_queue_first_update(heap,queue);
  }
  heap->page_count--;
  page->next = NULL;
  page->prev = NULL;
  // mi_atomic_store_ptr_release(mi_atomic_cast(void*, &page->heap), NULL);
  mi_page_set_in_full(page,false);
}